

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O3

void mg_path_destroy_ca(mg_path *path,mg_allocator *allocator)

{
  ulong uVar1;
  
  if (path != (mg_path *)0x0) {
    if (path->node_count != 0) {
      uVar1 = 0;
      do {
        mg_node_destroy_ca(path->nodes[uVar1],allocator);
        uVar1 = uVar1 + 1;
      } while (uVar1 < path->node_count);
    }
    if (path->relationship_count != 0) {
      uVar1 = 0;
      do {
        mg_unbound_relationship_destroy_ca(path->relationships[uVar1],allocator);
        uVar1 = uVar1 + 1;
      } while (uVar1 < path->relationship_count);
    }
    mg_allocator_free(allocator,path);
    return;
  }
  return;
}

Assistant:

void mg_path_destroy_ca(mg_path *path, mg_allocator *allocator) {
  if (!path) {
    return;
  }
  for (uint32_t i = 0; i < path->node_count; ++i) {
    mg_node_destroy_ca(path->nodes[i], allocator);
  }
  for (uint32_t i = 0; i < path->relationship_count; ++i) {
    mg_unbound_relationship_destroy_ca(path->relationships[i], allocator);
  }
  mg_allocator_free(allocator, path);
}